

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void preprocess_unsigned(aec_stream *strm)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  internal_state *piVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  ulong local_40;
  size_t i;
  uint32_t rsi;
  uint32_t xmax;
  uint32_t *d;
  uint32_t *x;
  internal_state *state;
  uint32_t D;
  aec_stream *strm_local;
  
  piVar4 = strm->state;
  puVar5 = piVar4->data_raw;
  puVar6 = piVar4->data_pp;
  uVar1 = piVar4->xmax;
  uVar2 = strm->rsi;
  uVar3 = strm->block_size;
  piVar4->ref = 1;
  piVar4->ref_sample = *puVar5;
  *puVar6 = 0;
  for (local_40 = 0; local_40 < uVar2 * uVar3 - 1; local_40 = local_40 + 1) {
    if (puVar5[local_40 + 1] < puVar5[local_40]) {
      if (uVar1 - puVar5[local_40] < puVar5[local_40] - puVar5[local_40 + 1]) {
        puVar6[local_40 + 1] = uVar1 - puVar5[local_40 + 1];
      }
      else {
        puVar6[local_40 + 1] = (puVar5[local_40] - puVar5[local_40 + 1]) * 2 - 1;
      }
    }
    else if (puVar5[local_40] < puVar5[local_40 + 1] - puVar5[local_40]) {
      puVar6[local_40 + 1] = puVar5[local_40 + 1];
    }
    else {
      puVar6[local_40 + 1] = (puVar5[local_40 + 1] - puVar5[local_40]) * 2;
    }
  }
  piVar4->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
  return;
}

Assistant:

static void preprocess_unsigned(struct aec_stream *strm)
{
    /**
       Preprocess RSI of unsigned samples.

       Combining preprocessing and converting to uint32_t in one loop
       is slower due to the data dependence on x_i-1.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    const uint32_t *restrict x = state->data_raw;
    uint32_t *restrict d = state->data_pp;
    uint32_t xmax = state->xmax;
    uint32_t rsi = strm->rsi * strm->block_size - 1;

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    for (size_t i = 0; i < rsi; i++) {
        if (x[i + 1] >= x[i]) {
            D = x[i + 1] - x[i];
            if (D <= x[i])
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1];
        } else {
            D = x[i] - x[i + 1];
            if (D <= xmax - x[i])
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}